

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O3

void __thiscall spdlog::details::c_formatter::format(c_formatter *this,log_msg *msg,tm *tm_time)

{
  MemoryWriter *w;
  Buffer<char> *pBVar1;
  long lVar2;
  size_t sVar3;
  
  lVar2 = (long)tm_time->tm_wday * 0x20;
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,*(char **)(days_abi_cxx11_ + lVar2),
             *(char **)(days_abi_cxx11_ + lVar2) + *(long *)(days_abi_cxx11_ + lVar2 + 8));
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  w = &msg->formatted;
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ' ';
  lVar2 = (long)tm_time->tm_mon * 0x20;
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,*(char **)(months_abi_cxx11_ + lVar2),
             *(char **)(months_abi_cxx11_ + lVar2) + *(long *)(months_abi_cxx11_ + lVar2 + 8));
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ' ';
  fmt::BasicWriter<char>::write_decimal<int>(&w->super_BasicWriter<char>,tm_time->tm_mday);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ' ';
  pad_n_join(w,tm_time->tm_hour,tm_time->tm_min,tm_time->tm_sec,':');
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ' ';
  fmt::BasicWriter<char>::write_decimal<int>(&w->super_BasicWriter<char>,tm_time->tm_year + 0x76c);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
        msg.formatted << days[tm_time.tm_wday] << ' ' << months[tm_time.tm_mon] << ' ' << tm_time.tm_mday << ' ';
        pad_n_join(msg.formatted, tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec, ':') << ' ' << tm_time.tm_year + 1900;
    }